

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devextra.c
# Opt level: O0

void do_gold(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  char *in_RSI;
  float fVar3;
  float gc;
  char buf [4608];
  CHAR_DATA *in_stack_ffffffffffffedd8;
  undefined4 in_stack_ffffffffffffede0;
  undefined4 in_stack_ffffffffffffede4;
  CHAR_DATA *in_stack_ffffffffffffede8;
  char *in_stack_ffffffffffffedf0;
  
  bVar1 = is_number((char *)in_stack_ffffffffffffedd8);
  if ((bVar1) && (iVar2 = get_trust(in_stack_ffffffffffffedd8), iVar2 == 0x3c)) {
    iVar2 = atoi(in_RSI);
    gold_constant = (long)iVar2;
    total_gold = num_pfiles * gold_constant;
    act(in_stack_ffffffffffffedf0,in_stack_ffffffffffffede8,
        (void *)CONCAT44(in_stack_ffffffffffffede4,in_stack_ffffffffffffede0),
        in_stack_ffffffffffffedd8,0);
  }
  else {
    act(in_stack_ffffffffffffedf0,in_stack_ffffffffffffede8,
        (void *)CONCAT44(in_stack_ffffffffffffede4,in_stack_ffffffffffffede0),
        in_stack_ffffffffffffedd8,0);
    act(in_stack_ffffffffffffedf0,in_stack_ffffffffffffede8,
        (void *)CONCAT44(in_stack_ffffffffffffede4,in_stack_ffffffffffffede0),
        in_stack_ffffffffffffedd8,0);
    sprintf(&stack0xffffffffffffede8,"Total gold in world  : %ld (%d players)\n\r",total_gold,
            (ulong)(uint)num_pfiles);
    send_to_char(in_stack_ffffffffffffedf0,in_stack_ffffffffffffede8);
    sprintf(&stack0xffffffffffffede8,"Gold held by players : %ld (%ldgp mobile held)\n\r",
            player_gold,total_gold - player_gold);
    send_to_char(in_stack_ffffffffffffedf0,in_stack_ffffffffffffede8);
    if (total_gold < 1) {
      fVar3 = 0.0;
    }
    else {
      fVar3 = ((float)(player_gold / total_gold) * 3.0 + 1.0) * 100.0;
    }
    sprintf(&stack0xffffffffffffede8,"Global inflation rate: %.1f%% (gold constant %ld)\n\r",
            (double)fVar3,gold_constant);
    send_to_char(in_stack_ffffffffffffedf0,in_stack_ffffffffffffede8);
  }
  return;
}

Assistant:

void do_gold(CHAR_DATA *ch, char *argument)
{
	char buf[MSL];
	float gc;

	if (is_number(argument) && get_trust(ch) == MAX_LEVEL)
	{
		gold_constant = atoi(argument);
		total_gold = num_pfiles * gold_constant;
		act("Global gold constant rate is now set to $t.", ch, argument, 0, TO_CHAR);
		return;
	}

	act("Riftshadow Gold System", ch, 0, 0, TO_CHAR);
	act("----------------------", ch, 0, 0, TO_CHAR);

	sprintf(buf, "Total gold in world  : %ld (%d players)\n\r", total_gold, num_pfiles);
	send_to_char(buf, ch);

	sprintf(buf, "Gold held by players : %ld (%ldgp mobile held)\n\r", player_gold, total_gold - player_gold);
	send_to_char(buf, ch);

	if (total_gold > 0)
		gc = (1.00f + 3.00f * (player_gold / total_gold)) * 100.00f;
	else
		gc = 0.00f;

	sprintf(buf, "Global inflation rate: %.1f%% (gold constant %ld)\n\r", gc, gold_constant);
	send_to_char(buf, ch);
}